

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmargins.cpp
# Opt level: O3

QDataStream * operator<<(QDataStream *s,QMargins *m)

{
  QDataStream *pQVar1;
  
  pQVar1 = QDataStream::operator<<(s,(m->m_left).m_i);
  pQVar1 = QDataStream::operator<<(pQVar1,(m->m_top).m_i);
  pQVar1 = QDataStream::operator<<(pQVar1,(m->m_right).m_i);
  QDataStream::operator<<(pQVar1,(m->m_bottom).m_i);
  return s;
}

Assistant:

QDataStream &operator<<(QDataStream &s, const QMargins &m)
{
    s << m.left() << m.top() << m.right() << m.bottom();
    return s;
}